

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tspm.cpp
# Opt level: O3

bool __thiscall pg::TSPMSolver::lift(TSPMSolver *this,int node,int target)

{
  int *pm;
  int d;
  int iVar1;
  Game *pGVar2;
  ulong uVar3;
  long lVar4;
  int *piVar5;
  int *piVar6;
  char cVar7;
  uint uVar8;
  bool bVar9;
  uint pl;
  ostream *poVar10;
  ulong uVar11;
  ulong uVar12;
  int to;
  uint uVar13;
  ulong uVar14;
  char *pcVar15;
  long lVar16;
  int to_1;
  ulong uVar17;
  ulong uVar18;
  int *piVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  uint local_84;
  uint local_80;
  uint local_7c;
  
  uVar14 = (ulong)node;
  pm = this->pms + this->k * uVar14;
  if ((*pm == -1) && (pm[1] == -1)) {
    return false;
  }
  this->lift_attempt = this->lift_attempt + 1;
  uVar18 = uVar14 >> 6;
  pGVar2 = (this->super_Solver).game;
  uVar3 = (pGVar2->_owner)._bits[uVar18];
  d = pGVar2->_priority[uVar14];
  uVar11 = (ulong)d;
  uVar17 = 1L << (uVar14 & 0x3f);
  bVar22 = (uVar3 & uVar17) == 0;
  bVar9 = !bVar22;
  pl = (uint)bVar22;
  if (1 < (this->super_Solver).trace) {
    poVar10 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\x1b[1mupdating node ",0x12);
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,node);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"/",1);
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,d);
    pcVar15 = " (odd)";
    bVar22 = ((((this->super_Solver).game)->_owner)._bits[uVar18] & uVar17) == 0;
    if (bVar22) {
      pcVar15 = " (even)";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar15,(ulong)bVar22 | 6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"\x1b[m with current progress measure",0x21);
    pm_stream(this,(this->super_Solver).logger,pm);
    poVar10 = (this->super_Solver).logger;
    cVar7 = (char)poVar10;
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + cVar7);
    std::ostream::put(cVar7);
    std::ostream::flush();
  }
  uVar21 = (ulong)pl;
  local_7c = 0xffffffff;
  uVar20 = (ulong)((uVar3 & uVar17) != 0);
  if (pm[uVar20] == -1) {
    local_80 = 0xffffffff;
LAB_0016ca7d:
    uVar13 = local_7c;
    if ((pm[uVar21] == -1) || ((target != -1 && (this->strategy[uVar14] != target))))
    goto LAB_0016cd39;
  }
  else {
    if (1 < (this->super_Solver).trace) {
      poVar10 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"computing max",0xd);
      std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      lVar4 = this->k;
      if ((long)uVar21 < lVar4) {
        piVar19 = this->tmp;
        uVar12 = uVar21;
        do {
          piVar19[uVar12] = pm[uVar12];
          uVar12 = uVar12 + 2;
        } while ((long)uVar12 < lVar4);
      }
    }
    if (target != -1) {
      Prog(this,this->tmp,this->pms + this->k * (long)target,d,(uint)bVar9);
      if (1 < (this->super_Solver).trace) {
        poVar10 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"successor node ",0xf);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,target);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"/",1);
        poVar10 = (ostream *)
                  std::ostream::operator<<(poVar10,((this->super_Solver).game)->_priority[target]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," results in",0xb);
        pm_stream(this,(this->super_Solver).logger,this->tmp);
        poVar10 = (this->super_Solver).logger;
        cVar7 = (char)poVar10;
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + cVar7);
        std::ostream::put(cVar7);
        std::ostream::flush();
      }
      piVar19 = this->tmp;
      bVar9 = pm_less(this,pm,piVar19,d,(uint)bVar9);
      local_80 = 0xffffffff;
      if (bVar9) {
        lVar4 = this->k;
        for (uVar12 = uVar20; (long)uVar12 < lVar4; uVar12 = uVar12 + 2) {
          pm[uVar12] = piVar19[uVar12];
        }
        local_7c = -(uint)((uVar3 & uVar17) == 0) | target;
        local_80 = -(uint)((uVar3 & uVar17) != 0) | target;
      }
      goto LAB_0016ca7d;
    }
    pGVar2 = (this->super_Solver).game;
    piVar19 = pGVar2->_outedges;
    iVar1 = pGVar2->_firstouts[uVar14];
    uVar13 = piVar19[iVar1];
    if (uVar13 != 0xffffffff) {
      piVar19 = piVar19 + iVar1;
      local_80 = 0xffffffff;
      local_7c = 0xffffffff;
      do {
        local_84 = (uint)bVar9;
        uVar12 = (ulong)(int)uVar13;
        uVar8 = local_7c;
        if ((((this->super_Solver).disabled)->_bits[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) == 0) {
          Prog(this,this->tmp,this->pms + this->k * uVar12,d,(uint)bVar9);
          if (1 < (this->super_Solver).trace) {
            poVar10 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"successor node ",0xf);
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,uVar13);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"/",1);
            poVar10 = (ostream *)
                      std::ostream::operator<<
                                (poVar10,((this->super_Solver).game)->_priority[uVar12]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," results in",0xb);
            pm_stream(this,(this->super_Solver).logger,this->tmp);
            poVar10 = (this->super_Solver).logger;
            cVar7 = (char)poVar10;
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + cVar7);
            std::ostream::put(cVar7);
            std::ostream::flush();
          }
          piVar5 = this->tmp;
          bVar22 = pm_less(this,pm,piVar5,d,local_84);
          if (bVar22) {
            lVar4 = this->k;
            for (uVar12 = uVar20; (long)uVar12 < lVar4; uVar12 = uVar12 + 2) {
              pm[uVar12] = piVar5[uVar12];
            }
            uVar8 = uVar13;
            if ((uVar17 & uVar3) == 0) {
              local_80 = uVar13;
              uVar8 = local_7c;
            }
          }
        }
        local_7c = uVar8;
        uVar13 = piVar19[1];
        piVar19 = piVar19 + 1;
      } while (uVar13 != 0xffffffff);
      goto LAB_0016ca7d;
    }
    local_7c = 0xffffffff;
    local_80 = 0xffffffff;
    uVar13 = local_7c;
    if (pm[uVar21] == -1) goto LAB_0016cd39;
  }
  if (1 < (this->super_Solver).trace) {
    poVar10 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"computing min",0xd);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((1 < (this->super_Solver).trace) && (lVar4 = this->k, (long)uVar20 < lVar4)) {
      piVar19 = this->tmp;
      do {
        piVar19[uVar20] = pm[uVar20];
        uVar20 = uVar20 + 2;
      } while ((long)uVar20 < lVar4);
    }
  }
  pGVar2 = (this->super_Solver).game;
  piVar19 = pGVar2->_outedges;
  iVar1 = pGVar2->_firstouts[uVar14];
  uVar13 = piVar19[iVar1];
  if (uVar13 == 0xffffffff) {
    local_84 = 0xffffffff;
  }
  else {
    piVar19 = piVar19 + iVar1;
    local_84 = 0xffffffff;
    do {
      uVar20 = (ulong)(int)uVar13;
      if ((((this->super_Solver).disabled)->_bits[uVar20 >> 6] >> (uVar20 & 0x3f) & 1) == 0) {
        Prog(this,this->tmp,this->pms + this->k * uVar20,d,pl);
        if (1 < (this->super_Solver).trace) {
          poVar10 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"successor node ",0xf);
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,uVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"/",1);
          poVar10 = (ostream *)
                    std::ostream::operator<<(poVar10,((this->super_Solver).game)->_priority[uVar20])
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," results in",0xb);
          pm_stream(this,(this->super_Solver).logger,this->tmp);
          poVar10 = (this->super_Solver).logger;
          cVar7 = (char)poVar10;
          std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + cVar7);
          std::ostream::put(cVar7);
          std::ostream::flush();
        }
        if (((local_84 == 0xffffffff) || (bVar9 = pm_less(this,this->tmp,this->best,d,pl), bVar9))
           && (lVar4 = this->k, local_84 = uVar13, 0 < lVar4)) {
          piVar5 = this->tmp;
          piVar6 = this->best;
          lVar16 = 0;
          do {
            piVar6[lVar16] = piVar5[lVar16];
            lVar16 = lVar16 + 1;
          } while (lVar4 != lVar16);
        }
      }
      uVar13 = piVar19[1];
      piVar19 = piVar19 + 1;
    } while (uVar13 != 0xffffffff);
  }
  this->strategy[uVar14] = local_84;
  piVar19 = this->best;
  bVar9 = pm_less(this,pm,piVar19,d,pl);
  uVar13 = local_7c;
  if (bVar9) {
    lVar4 = this->k;
    for (; (long)uVar21 < lVar4; uVar21 = uVar21 + 2) {
      pm[uVar21] = piVar19[uVar21];
    }
    uVar13 = local_84;
    if ((uVar3 & uVar17) != 0) {
      local_80 = local_84;
      uVar13 = local_7c;
    }
  }
LAB_0016cd39:
  local_7c = uVar13;
  if ((local_80 == 0xffffffff) && (local_7c == 0xffffffff)) {
    return false;
  }
  if ((this->super_Solver).trace != 0) {
    poVar10 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\x1b[1;32mupdated node ",0x14);
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,node);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"/",1);
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,d);
    pcVar15 = " (odd)";
    bVar9 = ((((this->super_Solver).game)->_owner)._bits[uVar18] & uVar17) == 0;
    if (bVar9) {
      pcVar15 = " (even)";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar15,(ulong)bVar9 | 6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\x1b[m to",6);
    pm_stream(this,(this->super_Solver).logger,pm);
    poVar10 = (this->super_Solver).logger;
    cVar7 = (char)poVar10;
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + cVar7);
    std::ostream::put(cVar7);
    std::ostream::flush();
  }
  if (((local_80 != 0xffffffff) && ((uVar11 & 1) == 0)) && (*pm == -1)) {
    this->counts[uVar11] = this->counts[uVar11] + -1;
  }
  if (((local_7c != 0xffffffff) && ((uVar11 & 1) != 0)) && (pm[1] == -1)) {
    this->counts[uVar11] = this->counts[uVar11] + -1;
  }
  this->lift_count = this->lift_count + 1;
  return true;
}

Assistant:

bool
TSPMSolver::lift(int node, int target)
{
    // obtain ptr to current progress measure
    int *pm = pms + k*node;

    // check if already Top for both players
    if (pm[0] == -1 and pm[1] == -1) return false;

    lift_attempt++;

    // initialize stuff
    const int pl_max = owner(node);
    const int pl_min = 1 - pl_max;
    const int d = priority(node);

#ifndef NDEBUG
    if (trace >= 2) {
        logger << "\033[1mupdating node " << node << "/" << d << (owner(node)?" (odd)":" (even)") << "\033[m with current progress measure";
        pm_stream(logger, pm);
        logger << std::endl;
    }
#endif

    int best_ch0 = -1, best_ch1 = -1;

    // do max for player <pl_max>
    if (pm[pl_max] != -1) {
#ifndef NDEBUG
        if (trace >= 2) {
            logger << "computing max" << std::endl;
            pm_copy(tmp, pm, 1-pl_max);
        }
#endif
        if (target != -1) {
            // just look at target
            Prog(tmp, pms + k*target, d, pl_max);
#ifndef NDEBUG
            if (trace >= 2) {
                logger << "successor node " << target << "/" << priority(target) << " results in";
                pm_stream(logger, tmp);
                logger << std::endl;
            }
#endif
            if (pm_less(pm, tmp, d, pl_max)) {
                pm_copy(pm, tmp, pl_max);
                if (pl_max) best_ch1 = target;
                else best_ch0 = target;
            }
        } else {
            for (auto curedge = outs(node); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                Prog(tmp, pms + k*to, d, pl_max);
#ifndef NDEBUG
                if (trace >= 2) {
                    logger << "successor node " << to << "/" << priority(to) << " results in";
                    pm_stream(logger, tmp);
                    logger << std::endl;
                }
#endif
                if (pm_less(pm, tmp, d, pl_max)) {
                    pm_copy(pm, tmp, pl_max);
                    if (pl_max) best_ch1 = to;
                    else best_ch0 = to;
                }
            }
        }
    }

    // do min for player <pl_min>
    if (pm[pl_min] != -1 and (target == -1 or target == strategy[node])) {
#ifndef NDEBUG
        if (trace >= 2) logger << "computing min" << std::endl;
        if (trace >= 2) pm_copy(tmp, pm, 1-pl_min);
#endif
        int best_to = -1;
        for (auto curedge = outs(node); *curedge != -1; curedge++) {
            int to = *curedge;
            if (disabled[to]) continue;
            Prog(tmp, pms + k*to, d, pl_min);
#ifndef NDEBUG
            if (trace >= 2) {
                logger << "successor node " << to << "/" << priority(to) << " results in";
                pm_stream(logger, tmp);
                logger << std::endl;
            }
#endif
            if (best_to == -1 or pm_less(tmp, best, d, pl_min)) {
                for (int i=0; i<k; i++) best[i] = tmp[i];
                best_to = to;
            }
        }

        strategy[node] = best_to;
        // note: sometimes only the strategy changes, but the lowest pm stays the same
        // now "best" contains the smallest Prog, which may be higher than the current min
        if (pm_less(pm, best, d, pl_min)) {
            pm_copy(pm, best, pl_min);
            if (pl_min) best_ch1 = best_to;
            else best_ch0 = best_to;
        }
    }

    bool ch0 = best_ch0 != -1;
    bool ch1 = best_ch1 != -1;

    if (ch0 or ch1) {
        if (trace) {
            logger << "\033[1;32mupdated node " << node << "/" << d << (owner(node)?" (odd)":" (even)") << "\033[m to";
            pm_stream(logger, pm);
            logger << std::endl;
        }
        // update counts if a changed pm is now Top, but only if priority has same parity as winner
        if (ch0 and pm[0] == -1 and (d&1) == 0) counts[d]--;
        if (ch1 and pm[1] == -1 and (d&1) == 1) counts[d]--;
        // increase count and return true
        lift_count++;
        return true;
    } else {
        return false;
    }
}